

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O3

exp_number __thiscall
ising::free_energy::square::transfer_matrix<float>::product_U
          (transfer_matrix<float> *this,uint_t Ly,real_t Jx,real_t beta,exp_number *factor,
          vector<float,_std::allocator<float>_> *v,vector<float,_std::allocator<float>_> *v_10,
          vector<float,_std::allocator<float>_> *v_20,vector<float,_std::allocator<float>_> *v_01,
          vector<float,_std::allocator<float>_> *v_02,vector<float,_std::allocator<float>_> *vt)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pfVar6;
  uint_t uVar7;
  ulong uVar8;
  pointer pfVar9;
  uint_t c0;
  ulong uVar10;
  uint_t c0_1;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  exp_number<float> local_38;
  
  uVar12 = (ulong)(1 << ((byte)Ly & 0x1f));
  fVar13 = expf(Jx * beta);
  fVar14 = expf(-beta * Jx);
  if (Ly != 0) {
    pfVar9 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar7 = 0;
    do {
      uVar8 = (ulong)(1 << ((byte)uVar7 & 0x1f));
      pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        uVar11 = uVar10 ^ uVar8;
        pfVar9[uVar10] =
             pfVar3[uVar11] * fVar14 + pfVar3[uVar10] * fVar13 +
             (Jx + Jx) * (pfVar2[uVar10] * fVar13 + pfVar2[uVar11] * -fVar14) +
             (pfVar1[uVar10] * fVar13 + pfVar1[uVar11] * fVar14) * Jx * Jx;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pfVar1 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar2 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar9;
      pfVar9 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar9;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar3;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar1;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar2;
      pfVar9 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pfVar3[uVar10] =
             pfVar4[uVar10] * fVar13 + pfVar4[uVar10 ^ uVar8] * fVar14 +
             (pfVar9[uVar10] * fVar13 + pfVar9[uVar10 ^ uVar8] * -fVar14) * Jx;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pfVar9 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar5 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar3;
      (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar1;
      (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar2;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar4;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar9;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar5;
      pfVar1 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pfVar4[uVar10] = pfVar1[uVar10] * fVar13 + pfVar1[uVar10 ^ uVar8] * fVar14;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pfVar2 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar3 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar4;
      (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar9;
      (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar5;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar1;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar2;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar3;
      pfVar4 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pfVar1[uVar10] = pfVar4[uVar10] * fVar13 + pfVar4[uVar10 ^ uVar8] * fVar14;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pfVar5 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar6 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar1;
      (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar2;
      (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar3;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar4;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar5;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar6;
      pfVar9 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pfVar4[uVar10] = pfVar9[uVar10] * fVar13 + pfVar9[uVar10 ^ uVar8] * fVar14;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar4;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar9;
      pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar5;
      (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar6;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar1;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar2;
      uVar7 = uVar7 + 1;
    } while (uVar7 != Ly);
  }
  fVar13 = 0.0;
  uVar8 = 0;
  do {
    fVar14 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start[uVar8];
    fVar13 = fVar13 + fVar14 * fVar14;
    uVar8 = uVar8 + 1;
  } while (uVar12 != uVar8);
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  fVar13 = 1.0 / fVar13;
  pfVar9 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar1 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar2 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar3 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar4 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar8 = 0;
  do {
    pfVar9[uVar8] = pfVar9[uVar8] * fVar13;
    pfVar1[uVar8] = pfVar1[uVar8] * fVar13;
    pfVar2[uVar8] = pfVar2[uVar8] * fVar13;
    pfVar3[uVar8] = pfVar3[uVar8] * fVar13;
    pfVar4[uVar8] = pfVar4[uVar8] * fVar13;
    uVar8 = uVar8 + 1;
  } while (uVar12 != uVar8);
  *(value_type_conflict *)this = factor->log_;
  *(int32_t *)(this + 4) = factor->sign_;
  standards::exp_number<float>::exp_number(&local_38,fVar13);
  standards::exp_number<float>::operator/=((exp_number<float> *)this,&local_38);
  return (exp_number)this;
}

Assistant:

static exp_number product_U(uint_t Ly, real_t Jx, real_t beta,
                              exp_number factor, std::vector<real_t> &v,
                              std::vector<real_t> &v_10,
                              std::vector<real_t> &v_20,
                              std::vector<real_t> &v_01,
                              std::vector<real_t> &v_02,
                              std::vector<real_t> &vt) {
    uint_t dim = 1 << Ly;
    boost::array<double, 2> weight;
    weight[0] = std::exp(beta * Jx);
    weight[1] = std::exp(-beta * Jx);
    for (uint_t s = 0; s < Ly; ++s) {
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * Jx * (weight[0] * v[c0] + weight[1] * v[c1]) +
                 2 * Jx * (weight[0] * v_10[c0] - weight[1] * v_10[c1]) +
                 (weight[0] * v_20[c0] + weight[1] * v_20[c1]);
      }
      std::swap(v_20, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * (weight[0] * v[c0] - weight[1] * v[c1]) +
                 (weight[0] * v_10[c0] + weight[1] * v_10[c1]);
      }
      std::swap(v_10, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_02[c0] + weight[1] * v_02[c1]);
      }
      std::swap(v_02, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_01[c0] + weight[1] * v_01[c1]);
      }
      std::swap(v_01, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = weight[0] * v[c0] + weight[1] * v[c1];
      }
      std::swap(v, vt);
    }
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      norm2 += v[c] * v[c];
    }
    real_t norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }